

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O3

void * __thiscall Span::malloc(Span *this,size_t __size)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar2 = (this->bitmap).size;
  uVar4 = 0;
  if (-2 < iVar2) {
    pcVar3 = (this->bitmap).bitmap;
    uVar5 = 0;
    uVar4 = 0;
    do {
      bVar1 = pcVar3[uVar5];
      if ((bVar1 >> (uVar4 & 7) & 1) == 0) {
        pcVar3[uVar5] = (byte)(1 << ((byte)uVar4 & 7)) | bVar1;
        break;
      }
      uVar4 = uVar4 + 1;
      uVar5 = (ulong)(uVar4 >> 3);
    } while (uVar4 >> 3 <= iVar2 + 1U);
  }
  this->allocCount = this->allocCount + 1;
  return (void *)((long)(int)uVar4 * (long)this->elemsize + (long)this->startAddr);
}

Assistant:

void *Span::malloc() {
  for (int i = 0; i < nelems; i++) {
    if (bitmap.Get(i) == 0) {
      bitmap.Set(i);
      allocCount++;
      // 注意这个地址的计算要测试一下
      return (void *)((char *)startAddr + elemsize * i);
    }
  }
}